

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void mpt_frange(float *range,int len,float *val,int ld)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  if (len == 0) {
    range[0] = 0.0;
    range[1] = 0.0;
  }
  else {
    fVar2 = *val;
    range[1] = fVar2;
    *range = fVar2;
    if (ld != 0) {
      fVar1 = fVar2;
      while (1 < len) {
        fVar3 = val[ld];
        if (fVar3 < fVar2) {
          *range = fVar3;
          fVar2 = fVar3;
          fVar3 = val[ld];
        }
        len = len + -1;
        val = val + ld;
        if (fVar1 < fVar3) {
          range[1] = fVar3;
          fVar1 = fVar3;
        }
      }
    }
  }
  return;
}

Assistant:

extern void MPT_RANGE_FCN(MPT_RANGE_T range[2], int len, const MPT_RANGE_T *val, int ld)
{
	if (!len) {
#ifdef __cplusplus
		range[0] = range[1] = MPT_RANGE_T();
#else
		range[0] = range[1] = 0;
#endif
		return;
	}
	range[0] = range[1] = *val;
	
	if (!ld) {
		return;
	}
	while (--len > 0) {
		val += ld;
		if (*val < range[0]) {
			range[0] = *val;
		}
		if (*val > range[1]) {
			range[1] = *val;
		}
	}
}